

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRConsoleNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRConsoleNode::render
          (VRConsoleNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  long *in_RDX;
  undefined8 in_RSI;
  VRDataIndex *in_stack_ffffffffffffff90;
  VRDataIndex *in_stack_ffffffffffffffa0;
  string local_58 [8];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [4];
  VRInt in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  VRDataIndex *in_stack_ffffffffffffffd8;
  
  VRDataIndex::pushState(in_stack_ffffffffffffff90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  VRDataIndex::addData
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  (**(code **)(*in_RDX + 8))(in_RDX,in_RSI);
  (**(code **)*in_RDX)(in_RDX,in_RSI);
  VRDataIndex::popState(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void VRConsoleNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {

  renderState->pushState();
	renderState->addData("/IsConsole", 1);

	renderHandler->onVRRenderContext(*renderState);
	renderHandler->onVRRenderScene(*renderState);

   renderState->popState();
}